

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O3

void __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::InitializeDecryption
          (AESStateMBEDTLS *this,const_data_ptr_t iv,idx_t iv_len,string *key)

{
  int iVar1;
  runtime_error local_40 [16];
  runtime_error local_30 [16];
  
  this->mode = DECRYPT;
  iVar1 = mbedtls_cipher_setkey
                    ((this->context).
                     super_unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                     ._M_t.
                     super___uniq_ptr_impl<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_mbedtls_cipher_context_t_*,_std::default_delete<mbedtls_cipher_context_t>_>
                     .super__Head_base<0UL,_mbedtls_cipher_context_t_*,_false>._M_head_impl,
                     (uchar *)(key->_M_dataplus)._M_p,(int)key->_M_string_length << 3,
                     MBEDTLS_DECRYPT);
  if (iVar1 != 0) {
    std::runtime_error::runtime_error(local_30,"Failed to set AES key for decryption");
    std::runtime_error::~runtime_error(local_30);
  }
  iVar1 = mbedtls_cipher_set_iv
                    ((this->context).
                     super_unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                     ._M_t.
                     super___uniq_ptr_impl<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_mbedtls_cipher_context_t_*,_std::default_delete<mbedtls_cipher_context_t>_>
                     .super__Head_base<0UL,_mbedtls_cipher_context_t_*,_false>._M_head_impl,iv,
                     iv_len);
  if (iVar1 != 0) {
    std::runtime_error::runtime_error(local_40,"Failed to set IV for decryption");
    std::runtime_error::~runtime_error(local_40);
  }
  return;
}

Assistant:

void MbedTlsWrapper::AESStateMBEDTLS::InitializeDecryption(duckdb::const_data_ptr_t iv, duckdb::idx_t iv_len, const std::string *key) {
	mode = DECRYPT;

	if (mbedtls_cipher_setkey(context.get(), reinterpret_cast<const unsigned char *>(key->data()), key->length() * 8, MBEDTLS_DECRYPT) != 0) {
		runtime_error("Failed to set AES key for decryption");
	}

	if (mbedtls_cipher_set_iv(context.get(), iv, iv_len) != 0) {
		runtime_error("Failed to set IV for decryption");
	}
}